

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# okiadpcm.c
# Opt level: O0

void compute_tables(void)

{
  int iVar1;
  double dVar2;
  int local_10;
  int stepval;
  int nib;
  int step;
  
  if (s_tables_computed == '\0') {
    s_tables_computed = '\x01';
    for (stepval = 0; stepval < 0x31; stepval = stepval + 1) {
      dVar2 = pow(1.1,(double)stepval);
      dVar2 = floor(dVar2 * 16.0);
      iVar1 = (int)dVar2;
      for (local_10 = 0; local_10 < 0x10; local_10 = local_10 + 1) {
        s_diff_lookup[stepval * 0x10 + local_10] =
             (short)compute_tables::nbl2bit[local_10][0] *
             ((short)iVar1 * (short)compute_tables::nbl2bit[local_10][1] +
              (short)(iVar1 / 2) * (short)compute_tables::nbl2bit[local_10][2] +
              (short)(iVar1 / 4) * (short)compute_tables::nbl2bit[local_10][3] + (short)(iVar1 / 8))
        ;
      }
    }
  }
  return;
}

Assistant:

static void compute_tables(void)
{
	// nibble to bit map
	static const INT8 nbl2bit[16][4] =
	{
		{ 1, 0, 0, 0}, { 1, 0, 0, 1}, { 1, 0, 1, 0}, { 1, 0, 1, 1},
		{ 1, 1, 0, 0}, { 1, 1, 0, 1}, { 1, 1, 1, 0}, { 1, 1, 1, 1},
		{-1, 0, 0, 0}, {-1, 0, 0, 1}, {-1, 0, 1, 0}, {-1, 0, 1, 1},
		{-1, 1, 0, 0}, {-1, 1, 0, 1}, {-1, 1, 1, 0}, {-1, 1, 1, 1}
	};
	int step, nib;

	// skip if we already did it
	if (s_tables_computed)
		return;
	s_tables_computed = 1;

	// loop over all possible steps
	for (step = 0; step <= 48; step++)
	{
		// compute the step value
		int stepval = (int)floor(16.0 * pow(11.0 / 10.0, (double)step));

		// loop over all nibbles and compute the difference
		for (nib = 0; nib < 16; nib++)
		{
			s_diff_lookup[step*16 + nib] = nbl2bit[nib][0] *
				(stepval   * nbl2bit[nib][1] +
					stepval/2 * nbl2bit[nib][2] +
					stepval/4 * nbl2bit[nib][3] +
					stepval/8);
		}
	}
	
	return;
}